

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

int encoder_append_uint32_value(ndn_encoder_t *encoder,uint32_t value)

{
  int i;
  int iVar1;
  int iVar2;
  
  if (encoder->output_max_size < encoder->offset + 4) {
    return -10;
  }
  iVar1 = 0;
  for (iVar2 = 0x18; iVar2 != -8; iVar2 = iVar2 + -8) {
    encoder->output_value[encoder->offset + iVar1] = (uint8_t)(value >> ((byte)iVar2 & 0x1f));
    iVar1 = iVar1 + 1;
  }
  encoder->offset = encoder->offset + 4;
  return 0;
}

Assistant:

static inline int
encoder_append_uint32_value(ndn_encoder_t* encoder, uint32_t value)
{
  if (encoder->offset + 4 > encoder->output_max_size)
    return NDN_OVERSIZE;
  for (int i = 0; i < 4; i++) {
    encoder->output_value[encoder->offset + i] = (value >> (8 * (3 - i))) & 0xFF;
  }
  encoder->offset += 4;
  return 0;
}